

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastErrorMessage::Operation<duckdb::string_t,duckdb::dtime_tz_t>
          (TryCastErrorMessage *this,string_t input,dtime_tz_t *result,CastParameters *parameters)

{
  string_t str;
  bool bVar1;
  char *pcVar2;
  char *buf;
  bool has_offset;
  idx_t pos;
  bool local_51;
  TryCastErrorMessage local_40 [16];
  idx_t local_30;
  
  pcVar2 = input.value._0_8_;
  buf = &stack0xffffffffffffffb4;
  if (0xc < (uint)this) {
    buf = pcVar2;
  }
  bVar1 = Time::TryConvertTimeTZ
                    (buf,(ulong)this & 0xffffffff,&local_30,input.value._8_8_,&local_51,
                     SUB81(result[1].bits,0),(optional_ptr<int,_true>)0x0);
  if (!bVar1) {
    str.value.pointer.ptr = pcVar2;
    str.value._0_8_ = this;
    Time::ConversionError_abi_cxx11_(str);
    HandleCastError::AssignError((string *)&stack0xffffffffffffffb0,(CastParameters *)result);
    if (this != local_40) {
      operator_delete(this);
    }
  }
  return bVar1;
}

Assistant:

bool TryCastErrorMessage::Operation(string_t input, dtime_tz_t &result, CastParameters &parameters) {
	if (!TryCast::Operation<string_t, dtime_tz_t>(input, result, parameters.strict)) {
		HandleCastError::AssignError(Time::ConversionError(input), parameters);
		return false;
	}
	return true;
}